

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O3

void helper_lcall_real_x86_64
               (CPUX86State *env,int new_cs,target_ulong new_eip1,int shift,int next_eip)

{
  int iVar1;
  target_ulong tVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uintptr_t unaff_retaddr;
  
  iVar1 = (int)env->regs[4];
  uVar4 = env->segs[2].flags;
  uVar5 = -(uint)((uVar4 >> 0x16 & 1) != 0) | 0xffff;
  if ((uVar4 >> 0x15 & 1) != 0) {
    uVar5 = 0;
  }
  tVar2 = env->segs[2].base;
  if (shift == 0) {
    uVar6 = 2;
    uVar4 = 2;
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar4 = 0, (~env->hflags & 3) != 0)) {
      uVar4 = (uint)env->eflags >> 0x11 & 2;
    }
    cpu_stw_mmuidx_ra_x86_64
              (env,(iVar1 - 2U & uVar5) + tVar2,env->segs[1].selector,uVar4,unaff_retaddr);
    uVar4 = iVar1 - 4;
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar6 = 0, (~env->hflags & 3) != 0)) {
      uVar6 = (uint)env->eflags >> 0x11 & 2;
    }
    cpu_stw_mmuidx_ra_x86_64(env,tVar2 + (uVar5 & uVar4),next_eip,uVar6,unaff_retaddr);
  }
  else {
    uVar6 = 2;
    uVar4 = 2;
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar4 = 0, (~env->hflags & 3) != 0)) {
      uVar4 = (uint)env->eflags >> 0x11 & 2;
    }
    cpu_stl_mmuidx_ra_x86_64
              (env,(ulong)((iVar1 - 4U & uVar5) + (int)tVar2),env->segs[1].selector,uVar4,
               unaff_retaddr);
    uVar4 = iVar1 - 8;
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar6 = 0, (~env->hflags & 3) != 0)) {
      uVar6 = (uint)env->eflags >> 0x11 & 2;
    }
    cpu_stl_mmuidx_ra_x86_64(env,(ulong)((uVar5 & uVar4) + (int)tVar2),next_eip,uVar6,unaff_retaddr)
    ;
  }
  if ((uVar5 == 0xffffffff) || (uVar5 != 0xffff)) {
    uVar3 = (ulong)uVar4;
  }
  else {
    uVar3 = (ulong)(uVar4 & 0xffff) | env->regs[4] & 0xffffffffffff0000;
  }
  env->regs[4] = uVar3;
  env->eip = (long)(int)new_eip1;
  env->segs[1].selector = new_cs;
  env->segs[1].base = (long)(new_cs << 4);
  return;
}

Assistant:

void helper_lcall_real(CPUX86State *env, int new_cs, target_ulong new_eip1,
                       int shift, int next_eip)
{
    int new_eip;
    uint32_t esp, esp_mask;
    target_ulong ssp;

    new_eip = new_eip1;
    esp = env->regs[R_ESP];
    esp_mask = get_sp_mask(env->segs[R_SS].flags);
    ssp = env->segs[R_SS].base;
    if (shift) {
        PUSHL_RA(ssp, esp, esp_mask, env->segs[R_CS].selector, GETPC());
        PUSHL_RA(ssp, esp, esp_mask, next_eip, GETPC());
    } else {
        PUSHW_RA(ssp, esp, esp_mask, env->segs[R_CS].selector, GETPC());
        PUSHW_RA(ssp, esp, esp_mask, next_eip, GETPC());
    }

    SET_ESP(esp, esp_mask);
    env->eip = new_eip;
    env->segs[R_CS].selector = new_cs;
    env->segs[R_CS].base = (new_cs << 4);
}